

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O0

bool __thiscall
mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::is_normalized
          (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *this)

{
  bool bVar1;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *in_RDI;
  
  sort_terms((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)0x266038);
  GetBody(in_RDI);
  bVar1 = QuadAndLinTerms::is_normalized((QuadAndLinTerms *)in_RDI);
  return bVar1;
}

Assistant:

bool is_normalized() {
    sort_terms();
    return GetBody().is_normalized();
  }